

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<QString,QList<QtDependency>>::tryEmplace_impl<QString_const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,QString *key)

{
  uchar uVar1;
  Span *pSVar2;
  Bucket BVar3;
  size_t hash;
  Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *pDVar4;
  Node<QString,_QList<QtDependency>_> *n;
  long in_FS_OFFSET;
  Bucket BVar5;
  Bucket local_50;
  QHash<QString,_QList<QtDependency>_> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = *this;
  if (pDVar4 == (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
    QHash<QString,_QList<QtDependency>_>::detach((QHash<QString,_QList<QtDependency>_> *)this);
    pDVar4 = *this;
  }
  local_40.d = (Data *)0x0;
  hash = qHash(key,pDVar4->seed);
  BVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_>::
          findBucketWithHash<QString>(pDVar4,key,hash);
  uVar1 = (BVar5.span)->offsets[BVar5.index];
  pDVar4 = *this;
  local_50 = BVar5;
  if ((pDVar4 == (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) ||
     (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>)) {
LAB_0012d2f0:
    QHash<QString,_QList<QtDependency>_>::operator=
              (&local_40,(QHash<QString,_QList<QtDependency>_> *)this);
    pDVar4 = *this;
    if ((uVar1 == 0xff) && (pDVar4->numBuckets >> 1 <= pDVar4->size)) {
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_>::detached
                         (pDVar4,pDVar4->size + 1);
      *(Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> **)this = pDVar4;
      local_50 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_>::
                 findBucketWithHash<QString>(pDVar4,key,hash);
    }
    else {
      pSVar2 = pDVar4->spans;
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_>::detached
                         (pDVar4);
      *(Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> **)this = pDVar4;
      local_50.index._0_4_ = (uint)BVar5.index & 0x7f;
      BVar3.index._0_4_ = (uint)local_50.index;
      BVar3.span = pDVar4->spans +
                   ((((long)BVar5.span - (long)pSVar2) / 0x90 << 7 | BVar5.index) >> 7);
      BVar3.index._4_4_ = 0;
      local_50.span =
           pDVar4->spans + ((((long)BVar5.span - (long)pSVar2) / 0x90 << 7 | BVar5.index) >> 7);
      local_50.index._4_4_ = 0;
      if (uVar1 != 0xff) {
        pDVar4 = *this;
        BVar5 = BVar3;
        goto LAB_0012d3b2;
      }
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_0012d3b2;
    if (pDVar4->numBuckets >> 1 <= pDVar4->size) goto LAB_0012d2f0;
  }
  n = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_>::Bucket::insert
                (&local_50);
  QHashPrivate::Node<QString,_QList<QtDependency>_>::createInPlace<>(n,key);
  pDVar4 = *this;
  pDVar4->size = pDVar4->size + 1;
  BVar5 = local_50;
LAB_0012d3b2:
  pSVar2 = pDVar4->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar4;
  (__return_storage_ptr__->iterator).i.bucket =
       ((long)BVar5.span - (long)pSVar2) / 0x90 << 7 | BVar5.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QString,_QList<QtDependency>_>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }